

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZKrylovEigenSolver.cpp
# Opt level: O0

int __thiscall
TPZKrylovEigenSolver<std::complex<double>_>::SolveGeneralisedEigenProblem
          (TPZKrylovEigenSolver<std::complex<double>_> *this,TPZVec<std::complex<double>_> *w)

{
  int iVar1;
  TPZFMatrix<std::complex<double>_> eigenVectors;
  undefined1 in_stack_000037f7;
  TPZFMatrix<std::complex<double>_> *in_stack_000037f8;
  TPZVec<std::complex<double>_> *in_stack_00003800;
  TPZKrylovEigenSolver<std::complex<double>_> *in_stack_00003808;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff70;
  
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(in_stack_ffffffffffffff70);
  iVar1 = SolveImpl(in_stack_00003808,in_stack_00003800,in_stack_000037f8,(bool)in_stack_000037f7);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x11acfbc);
  return iVar1;
}

Assistant:

int TPZKrylovEigenSolver<TVar>::SolveGeneralisedEigenProblem(TPZVec<CTVar> &w)
{
  TPZFMatrix<CTVar> eigenVectors;
  return SolveImpl(w, eigenVectors,false);
}